

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BindDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BindDirectiveSyntax,slang::syntax::BindDirectiveSyntax_const&>
          (BumpAllocator *this,BindDirectiveSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  NameSyntax *pNVar4;
  BindTargetListSyntax *pBVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  BindDirectiveSyntax *pBVar10;
  
  pBVar10 = (BindDirectiveSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BindDirectiveSyntax *)this->endPtr < pBVar10 + 1) {
    pBVar10 = (BindDirectiveSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pBVar10 + 1);
  }
  (pBVar10->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pBVar10->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pBVar10->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pBVar10->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar6 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pBVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pBVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6
  ;
  (pBVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pBVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pBVar10->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005dad10;
  (pBVar10->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pBVar10->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pBVar10->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pBVar10->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005dac60;
  uVar7 = (args->bind).field_0x2;
  NVar8.raw = (args->bind).numFlags.raw;
  uVar9 = (args->bind).rawLen;
  pIVar3 = (args->bind).info;
  pNVar4 = (args->target).ptr;
  pBVar5 = args->targetInstances;
  (pBVar10->bind).kind = (args->bind).kind;
  (pBVar10->bind).field_0x2 = uVar7;
  (pBVar10->bind).numFlags = (NumericTokenFlags)NVar8.raw;
  (pBVar10->bind).rawLen = uVar9;
  (pBVar10->bind).info = pIVar3;
  (pBVar10->target).ptr = pNVar4;
  pBVar10->targetInstances = pBVar5;
  (pBVar10->instantiation).ptr = (args->instantiation).ptr;
  return pBVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }